

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AvalancheTest.h
# Opt level: O0

void calcBias<Blob<1536>,Blob<256>>
               (pfHash hash,vector<int,_std::allocator<int>_> *counts,int reps,Rand *r,bool verbose)

{
  uint32_t uVar1;
  uint32_t uVar2;
  int in_EDX;
  vector<int,_std::allocator<int>_> *in_RSI;
  code *in_RDI;
  byte in_R8B;
  int bitB;
  int bitA;
  int iOut;
  int iBit;
  int *cursor;
  int irep;
  Blob<256> B;
  Blob<256> A;
  Blob<1536> K;
  int hashbits;
  int keybits;
  int hashbytes;
  int keybytes;
  uint32_t local_148;
  uint32_t local_144;
  int *in_stack_fffffffffffffec0;
  int iVar3;
  undefined4 in_stack_fffffffffffffecc;
  Rand *in_stack_fffffffffffffed0;
  Blob<256> local_114;
  Blob<1536> local_f4;
  undefined4 local_34;
  undefined4 local_30;
  undefined4 local_2c;
  undefined4 local_28;
  byte local_21;
  int local_14;
  vector<int,_std::allocator<int>_> *local_10;
  code *local_8;
  
  local_21 = in_R8B & 1;
  local_28 = 0xc0;
  local_2c = 0x20;
  local_30 = 0x600;
  local_34 = 0x100;
  local_14 = in_EDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  Blob<1536>::Blob(&local_f4);
  Blob<256>::Blob(&local_114);
  Blob<256>::Blob((Blob<256> *)&stack0xfffffffffffffecc);
  for (iVar3 = 0; iVar3 < local_14; iVar3 = iVar3 + 1) {
    if (((local_21 & 1) != 0) && (iVar3 % (local_14 / 10) == 0)) {
      printf(".");
    }
    Rand::rand_p(in_stack_fffffffffffffed0,(void *)CONCAT44(in_stack_fffffffffffffecc,iVar3),
                 (int)((ulong)in_stack_fffffffffffffec0 >> 0x20));
    (*local_8)(&local_f4,0xc0,0,&local_114);
    in_stack_fffffffffffffec0 = std::vector<int,_std::allocator<int>_>::operator[](local_10,0);
    for (local_144 = 0; (int)local_144 < 0x600; local_144 = local_144 + 1) {
      flipbit(&local_f4,0xc0,local_144);
      (*local_8)(&local_f4,0xc0,0,&stack0xfffffffffffffecc);
      flipbit(&local_f4,0xc0,local_144);
      for (local_148 = 0; (int)local_148 < 0x100; local_148 = local_148 + 1) {
        uVar1 = getbit(&local_114,0x20,local_148);
        uVar2 = getbit(&stack0xfffffffffffffecc,0x20,local_148);
        *in_stack_fffffffffffffec0 = (uVar1 ^ uVar2) + *in_stack_fffffffffffffec0;
        in_stack_fffffffffffffec0 = in_stack_fffffffffffffec0 + 1;
      }
    }
  }
  return;
}

Assistant:

void calcBias ( pfHash hash, std::vector<int> & counts, int reps, Rand & r, bool verbose )
{
  const int keybytes = sizeof(keytype);
  const int hashbytes = sizeof(hashtype);

  const int keybits = keybytes * 8;
  const int hashbits = hashbytes * 8;

  keytype K;
  hashtype A,B;

  for(int irep = 0; irep < reps; irep++)
  {
    if(verbose) {
      if(irep % (reps/10) == 0) printf(".");
    }

    r.rand_p(&K,keybytes);

    hash(&K,keybytes,0,&A);

    int * cursor = &counts[0];

    for(int iBit = 0; iBit < keybits; iBit++)
    {
      flipbit(&K,keybytes,iBit);
      hash(&K,keybytes,0,&B);
      flipbit(&K,keybytes,iBit);

      for(int iOut = 0; iOut < hashbits; iOut++)
      {
        int bitA = getbit(&A,hashbytes,iOut);
        int bitB = getbit(&B,hashbytes,iOut);

        (*cursor++) += (bitA ^ bitB);
      }
    }
  }
}